

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem2der.c
# Opt level: O1

int convert_pem_to_der(uchar *input,size_t ilen,uchar *output,size_t *olen)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  uchar *puVar5;
  size_t slen;
  uchar *puVar6;
  size_t len;
  size_t local_38;
  
  local_38 = 0;
  pcVar3 = strstr((char *)input,"-----BEGIN");
  iVar2 = -1;
  if (pcVar3 != (char *)0x0) {
    puVar4 = (uchar *)strstr((char *)input,"-----END");
    if (puVar4 != (uchar *)0x0) {
      puVar6 = input + ilen;
      for (puVar5 = (uchar *)(pcVar3 + 10); (puVar5 < puVar6 && (*puVar5 != '-'));
          puVar5 = puVar5 + 1) {
      }
      for (; (puVar5 < puVar6 && (*puVar5 == '-')); puVar5 = puVar5 + 1) {
      }
      puVar5 = puVar5 + (ulong)(puVar5[*puVar5 == '\r'] == '\n') + (ulong)(*puVar5 == '\r');
      slen = (long)puVar4 - (long)puVar5;
      if (puVar4 <= puVar6 && (puVar5 <= puVar4 && slen != 0)) {
        iVar1 = mbedtls_base64_decode((uchar *)0x0,0,&local_38,puVar5,slen);
        iVar2 = -0x2c;
        if (iVar1 != -0x2c) {
          iVar2 = -1;
          if (local_38 <= *olen) {
            iVar2 = mbedtls_base64_decode(output,local_38,&local_38,puVar5,slen);
            if (iVar2 == 0) {
              *olen = local_38;
              iVar2 = 0;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int convert_pem_to_der( const unsigned char *input, size_t ilen,
                        unsigned char *output, size_t *olen )
{
    int ret;
    const unsigned char *s1, *s2, *end = input + ilen;
    size_t len = 0;

    s1 = (unsigned char *) strstr( (const char *) input, "-----BEGIN" );
    if( s1 == NULL )
        return( -1 );

    s2 = (unsigned char *) strstr( (const char *) input, "-----END" );
    if( s2 == NULL )
        return( -1 );

    s1 += 10;
    while( s1 < end && *s1 != '-' )
        s1++;
    while( s1 < end && *s1 == '-' )
        s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;

    if( s2 <= s1 || s2 > end )
        return( -1 );

    ret = mbedtls_base64_decode( NULL, 0, &len, (const unsigned char *) s1, s2 - s1 );
    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( ret );

    if( len > *olen )
        return( -1 );

    if( ( ret = mbedtls_base64_decode( output, len, &len, (const unsigned char *) s1,
                               s2 - s1 ) ) != 0 )
    {
        return( ret );
    }

    *olen = len;

    return( 0 );
}